

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O2

int ImGuiStb::stb_text_locate_coord(ImGuiTextEditState *str,float x,float y)

{
  int iVar1;
  ImWchar IVar2;
  int iVar3;
  int iVar4;
  int char_idx;
  int iVar5;
  float fVar6;
  float local_4c;
  StbTexteditRow local_40;
  
  iVar4 = str->CurLenW;
  local_40.x0 = 0.0;
  local_40.x1 = 0.0;
  local_40.ymin = 0.0;
  local_40.ymax = 0.0;
  local_40.num_chars = 0;
  fVar6 = 0.0;
  iVar3 = 0;
  while( true ) {
    if (iVar4 <= iVar3) {
      return iVar4;
    }
    STB_TEXTEDIT_LAYOUTROW(&local_40,str,iVar3);
    iVar1 = local_40.num_chars;
    if (local_40.num_chars < 1) break;
    if ((iVar3 == 0) && (y < local_40.ymin + fVar6)) {
      return 0;
    }
    if (y < local_40.ymax + fVar6) {
      if (x < local_40.x0) {
        return iVar3;
      }
      iVar4 = iVar3;
      if (x < local_40.x1) {
        local_4c = local_40.x0;
        char_idx = 0;
        for (iVar5 = 0; iVar4 = iVar1, iVar1 + iVar5 != 0; iVar5 = iVar5 + -1) {
          fVar6 = STB_TEXTEDIT_GETWIDTH(str,iVar3,char_idx);
          if (x < local_4c + fVar6) {
            if (x < local_4c + fVar6 * 0.5) {
              return iVar3 - iVar5;
            }
            return (iVar3 - iVar5) + 1;
          }
          char_idx = char_idx + 1;
          local_4c = local_4c + fVar6;
        }
      }
      iVar3 = iVar4 + iVar1 + -1;
      IVar2 = STB_TEXTEDIT_GETCHAR(str,iVar3);
      if (IVar2 != 10) {
        return iVar1 + iVar4;
      }
      return iVar3;
    }
    iVar3 = iVar3 + local_40.num_chars;
    fVar6 = fVar6 + local_40.baseline_y_delta;
  }
  return iVar4;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      k = i;
      prev_x = r.x0;
      for (i=0; i < r.num_chars; ++i) {
         float w = STB_TEXTEDIT_GETWIDTH(str, k, i);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}